

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPrimvarReader_normal *shader,
          uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  uint32_t indent_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  indent_00 = (uint32_t)shader;
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:varname","");
  print_str_attr(&local_1e0,
                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this + 0x998),&local_200,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  paVar1 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:fallback","");
  print_typed_attr<tinyusdz::value::normal3f>
            (&local_1e0,
             (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)(this + 0x730),
             &local_200,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"outputs:result","");
  print_typed_terminal_attr<tinyusdz::value::normal3f>
            (&local_1e0,(TypedTerminalAttribute<tinyusdz::value::normal3f> *)(this + 0xc18),
             &local_200,indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  print_common_shader_params_abi_cxx11_
            (&local_1e0,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string print_shader_params(const UsdPrimvarReader_normal &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_str_attr(shader.varname, "inputs:varname", indent);
  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);
  ss << print_typed_terminal_attr(shader.result, "outputs:result", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}